

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::CappedArray<char,_5UL>_>::~ArrayBuilder
          (ArrayBuilder<kj::CappedArray<char,_5UL>_> *this)

{
  CappedArray<char,_5UL> *pCVar1;
  RemoveConst<kj::CappedArray<char,_5UL>_> *pRVar2;
  CappedArray<char,_5UL> *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CappedArray<char,_5UL> *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (CappedArray<char,_5UL> *)0x0;
    this->pos = (RemoveConst<kj::CappedArray<char,_5UL>_> *)0x0;
    this->endPtr = (CappedArray<char,_5UL> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pCVar1,0x10,(long)pRVar2 - (long)pCVar1 >> 4,
               (long)pCVar3 - (long)pCVar1 >> 4,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }